

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_avx2.h
# Opt level: O0

void xy_x_round_store_32_avx2(__m256i *res,int16_t *dst)

{
  undefined1 auVar1 [32];
  __m256i src;
  __m256i src_00;
  undefined1 auVar2 [32];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 (*in_RSI) [16];
  undefined8 *in_RDI;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  longlong lVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  __m256i d1;
  __m256i d0;
  __m256i r [2];
  undefined8 local_160;
  undefined8 uStackY_158;
  undefined8 uStackY_150;
  undefined8 uStackY_148;
  undefined8 in_stack_fffffffffffffed8;
  undefined8 in_stack_fffffffffffffee0;
  undefined8 in_stack_fffffffffffffee8;
  longlong in_stack_fffffffffffffef0;
  
  uVar5 = *in_RDI;
  uVar7 = in_RDI[1];
  lVar9 = in_RDI[2];
  uVar11 = in_RDI[3];
  src[1] = in_stack_fffffffffffffee0;
  src[0] = in_stack_fffffffffffffed8;
  src[2] = in_stack_fffffffffffffee8;
  src[3] = in_stack_fffffffffffffef0;
  xy_x_round_avx2(src);
  uVar6 = in_RDI[4];
  uVar8 = in_RDI[5];
  uVar10 = in_RDI[6];
  uVar12 = in_RDI[7];
  src_00[1] = uVar5;
  src_00[0] = in_stack_fffffffffffffed8;
  src_00[2] = uVar7;
  src_00[3] = lVar9;
  xy_x_round_avx2(src_00);
  auVar3._8_8_ = uVar7;
  auVar3._0_8_ = uVar5;
  auVar2._16_8_ = lVar9;
  auVar2._0_16_ = auVar3;
  auVar2._24_8_ = uVar11;
  auVar4._8_8_ = uVar8;
  auVar4._0_8_ = uVar6;
  auVar1._8_8_ = uVar8;
  auVar1._0_8_ = uVar6;
  auVar1._16_8_ = uVar10;
  auVar1._24_8_ = uVar12;
  auVar1 = vblendps_avx(auVar1,ZEXT1632(CONCAT88(uVar11,lVar9)),0xf);
  *in_RSI = ZEXT116(0) * auVar4 + ZEXT116(1) * auVar3;
  in_RSI[1] = ZEXT116(0) * auVar2._16_16_ + ZEXT116(1) * auVar4;
  local_160 = auVar1._0_8_;
  uStackY_158 = auVar1._8_8_;
  uStackY_150 = auVar1._16_8_;
  uStackY_148 = auVar1._24_8_;
  *(undefined8 *)in_RSI[2] = local_160;
  *(undefined8 *)(in_RSI[2] + 8) = uStackY_158;
  *(undefined8 *)in_RSI[3] = uStackY_150;
  *(undefined8 *)(in_RSI[3] + 8) = uStackY_148;
  return;
}

Assistant:

static inline void xy_x_round_store_32_avx2(const __m256i res[2],
                                            int16_t *const dst) {
  __m256i r[2];

  r[0] = xy_x_round_avx2(res[0]);
  r[1] = xy_x_round_avx2(res[1]);
  const __m256i d0 =
      _mm256_inserti128_si256(r[0], _mm256_castsi256_si128(r[1]), 1);
  const __m256i d1 =
      _mm256_inserti128_si256(r[1], _mm256_extracti128_si256(r[0], 1), 0);
  _mm256_storeu_si256((__m256i *)dst, d0);
  _mm256_storeu_si256((__m256i *)(dst + 16), d1);
}